

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

string * __thiscall
clickhouse::ColumnEnum<short>::NameAt_abi_cxx11_
          (string *__return_storage_ptr__,ColumnEnum<short> *this,size_t n)

{
  const_reference pvVar1;
  string *psVar2;
  EnumType EStack_28;
  
  EnumType::EnumType(&EStack_28,&(this->super_Column).type_);
  pvVar1 = std::vector<short,_std::allocator<short>_>::at(&this->data_,n);
  psVar2 = EnumType::GetEnumName_abi_cxx11_(&EStack_28,*pvVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&EStack_28.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

const std::string ColumnEnum<T>::NameAt(size_t n) const {
    return EnumType(type_).GetEnumName(data_.at(n));
}